

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateCacheVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::PipelineStateCacheVkImpl::GetData(PipelineStateCacheVkImpl *this,IDataBlob **ppBlob)

{
  VkDevice pVVar1;
  VkPipelineCache pVVar2;
  PFN_vkGetPipelineCacheData p_Var3;
  IObject IVar4;
  VkResult VVar5;
  void *pvVar6;
  RefCntAutoPtr<Diligent::DataBlobImpl> pDataBlob;
  size_t DataSize;
  IObject local_50;
  string local_48;
  
  if (ppBlob == (IDataBlob **)0x0) {
    FormatString<char[24]>(&local_48,(char (*) [24])"ppBlob must not be null");
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"GetData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateCacheVkImpl.cpp"
               ,0x55);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  *ppBlob = (IDataBlob *)0x0;
  pVVar1 = ((((this->super_PipelineStateCacheBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IPipelineStateCacheVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateCacheDesc>
             .m_pDevice)->m_LogicalVkDevice).
            super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->m_VkDevice;
  local_48._M_dataplus._M_p = (pointer)0x0;
  VVar5 = (*vkGetPipelineCacheData)
                    (pVVar1,(this->m_PipelineStateCache).m_VkObject,(size_t *)&local_48,(void *)0x0)
  ;
  if (VVar5 == VK_SUCCESS) {
    DataBlobImpl::Create((DataBlobImpl *)&local_50,(size_t)local_48._M_dataplus._M_p,(void *)0x0);
    p_Var3 = vkGetPipelineCacheData;
    pVVar2 = (this->m_PipelineStateCache).m_VkObject;
    pvVar6 = DataBlobImpl::GetDataPtr((DataBlobImpl *)local_50._vptr_IObject,0);
    VVar5 = (*p_Var3)(pVVar1,pVVar2,(size_t *)&local_48,pvVar6);
    IVar4._vptr_IObject = local_50._vptr_IObject;
    if (VVar5 == VK_SUCCESS) {
      local_50._vptr_IObject = (_func_int **)0x0;
      *ppBlob = (IDataBlob *)IVar4._vptr_IObject;
    }
    RefCntAutoPtr<Diligent::DataBlobImpl>::Release
              ((RefCntAutoPtr<Diligent::DataBlobImpl> *)&local_50);
  }
  return;
}

Assistant:

void PipelineStateCacheVkImpl::GetData(IDataBlob** ppBlob)
{
    DEV_CHECK_ERR(ppBlob != nullptr, "ppBlob must not be null");
    *ppBlob = nullptr;

    const auto vkDevice = m_pDevice->GetLogicalDevice().GetVkDevice();

    size_t DataSize = 0;
    if (vkGetPipelineCacheData(vkDevice, m_PipelineStateCache, &DataSize, nullptr) != VK_SUCCESS)
        return;

    auto pDataBlob = DataBlobImpl::Create(DataSize);

    if (vkGetPipelineCacheData(vkDevice, m_PipelineStateCache, &DataSize, pDataBlob->GetDataPtr()) != VK_SUCCESS)
        return;

    *ppBlob = pDataBlob.Detach();
}